

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

void upb_Decoder_AddMessageSetItem
               (upb_Decoder *d,upb_Message *msg,upb_MiniTable *t,uint32_t type_id,char *data,
               uint32_t size)

{
  anon_union_56_2_073d5ac0_for_upb_Decoder_8 *arena;
  bool bVar1;
  ulong len;
  size_t sVar2;
  _Bool _Var3;
  upb_DecodeStatus status;
  upb_MiniTableExtension *e;
  upb_Extension *puVar4;
  upb_Message *msg_00;
  uint uVar5;
  upb_MiniTable *mt;
  byte bVar7;
  size_t sVar8;
  undefined8 local_80;
  byte local_78 [72];
  ulong uVar6;
  
  len = (ulong)size;
  local_80 = data;
  e = upb_ExtensionRegistry_Lookup(d->extreg,t,type_id);
  if (e == (upb_MiniTableExtension *)0x0) {
    local_78[0] = 0xb;
    local_78[1] = 0x10;
    sVar2 = 3;
    do {
      sVar8 = sVar2;
      *(byte *)((long)&local_80 + sVar8 + 7) = (0x7f < type_id) << 7 | (byte)type_id & 0x7f;
      bVar1 = 0x7f < type_id;
      sVar2 = sVar8 + 1;
      type_id = type_id >> 7;
    } while (bVar1);
    local_78[sVar8] = 0x1a;
    uVar6 = len;
    do {
      sVar8 = sVar2;
      uVar5 = (uint)uVar6;
      bVar7 = (byte)uVar6;
      uVar6 = uVar6 >> 7;
      local_78[sVar8] = (0x7f < uVar5) << 7 | bVar7 & 0x7f;
      sVar2 = sVar8 + 1;
    } while (0x7f < uVar5);
    local_78[sVar8 + 1] = 0xc;
    arena = &d->field_8;
    _Var3 = _upb_Message_AddUnknown_dont_copy_me__upb_internal_use_only
                      (msg,(char *)local_78,sVar8 + 1,&arena->arena);
    if (((_Var3) &&
        (_Var3 = _upb_Message_AddUnknown_dont_copy_me__upb_internal_use_only
                           (msg,local_80,len,&arena->arena), _Var3)) &&
       (_Var3 = _upb_Message_AddUnknown_dont_copy_me__upb_internal_use_only
                          (msg,(char *)(local_78 + sVar8 + 1),1,&arena->arena), _Var3)) {
      return;
    }
  }
  else {
    puVar4 = _upb_Message_GetOrCreateExtension_dont_copy_me__upb_internal_use_only
                       (msg,e,&(d->field_8).arena);
    if (puVar4 != (upb_Extension *)0x0) {
      msg_00 = _upb_Decoder_NewSubMessage2
                         (d,(puVar4->ext->sub_dont_copy_me__upb_internal_use_only).
                            submsg_dont_copy_me__upb_internal_use_only,
                          &puVar4->ext->field_dont_copy_me__upb_internal_use_only,
                          (upb_TaggedMessagePtr *)&(puVar4->data).uint32_val);
      bVar7 = (e->field_dont_copy_me__upb_internal_use_only).
              descriptortype_dont_copy_me__upb_internal_use_only;
      if (((e->field_dont_copy_me__upb_internal_use_only).mode_dont_copy_me__upb_internal_use_only &
          0x10) == 0) {
        if ((ulong)(bVar7 - 1) - 9 < 2) {
          mt = (e->sub_dont_copy_me__upb_internal_use_only).
               submsg_dont_copy_me__upb_internal_use_only;
        }
        else {
          mt = (upb_MiniTable *)0x0;
        }
      }
      else {
        mt = (upb_MiniTable *)0x0;
        if ((bVar7 != 5) && (mt = (upb_MiniTable *)0x0, bVar7 != 0xc)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/mini_table/internal/field.h"
                        ,0x7b,
                        "upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)");
        }
      }
      status = upb_Decode(local_80,len,msg_00,mt,d->extreg,(uint)d->options,&(d->field_8).arena);
      if (status == kUpb_DecodeStatus_Ok) {
        return;
      }
      _upb_Decoder_ErrorJmp(d,status);
    }
  }
  _upb_Decoder_ErrorJmp(d,kUpb_DecodeStatus_OutOfMemory);
}

Assistant:

static void upb_Decoder_AddMessageSetItem(upb_Decoder* d, upb_Message* msg,
                                          const upb_MiniTable* t,
                                          uint32_t type_id, const char* data,
                                          uint32_t size) {
  const upb_MiniTableExtension* item_mt =
      upb_ExtensionRegistry_Lookup(d->extreg, t, type_id);
  if (item_mt) {
    upb_Decoder_AddKnownMessageSetItem(d, msg, item_mt, data, size);
  } else {
    upb_Decoder_AddUnknownMessageSetItem(d, msg, type_id, data, size);
  }
}